

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WildLCS.cpp
# Opt level: O1

vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* __thiscall
WildLCS::gen_rules_abi_cxx11_
          (vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *__return_storage_ptr__,WildLCS *this)

{
  pointer pvVar1;
  pointer pbVar2;
  size_t __n;
  pointer ppVar3;
  vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *pvVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  const_iterator cVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  key_type kVar13;
  pointer ppVar14;
  pointer pbVar15;
  ulong uVar16;
  int new_node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  H;
  vector<int,_std::allocator<int>_> token_id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  cur_H;
  string cur_string;
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  used;
  unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  rules;
  _Hashtable<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  local_148;
  long local_128;
  long local_120;
  void *local_118;
  iterator iStack_110;
  int *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  undefined1 *local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_88;
  vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  *local_70;
  _Hashtable<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_70 = (vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)__return_storage_ptr__;
  std::
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&local_88,
           ((long)(this->trie).
                  super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->trie).
                  super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
           (allocator_type *)&local_d8);
  local_148.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (this->super_RuleGenerator).n) {
    local_128 = 0;
    do {
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
      local_118 = (void *)0x0;
      iStack_110._M_current = (int *)0x0;
      local_108 = (int *)0x0;
      local_d8.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_d8.first.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      pvVar1 = (this->super_RuleGenerator).tokens.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = local_128 * 3;
      local_120 = lVar12;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pvVar1[local_128].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&pvVar1[local_128].
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5)) {
        do {
          if (0 < *(int *)(*(long *)((long)&(((this->super_RuleGenerator).tokens.
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar12 * 8) + 8 +
                          (long)(int)local_d8.first.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start * 0x20)) {
            lVar11 = 0;
            do {
              std::__cxx11::string::push_back((char)(string *)&local_a8);
              if (iStack_110._M_current == local_108) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_118,iStack_110,(int *)&local_d8
                          );
              }
              else {
                *iStack_110._M_current =
                     (int)local_d8.first.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iStack_110._M_current = iStack_110._M_current + 1;
              }
              lVar11 = lVar11 + 1;
              lVar12 = local_120;
            } while (lVar11 < *(int *)(*(long *)((long)&(((this->super_RuleGenerator).tokens.
                                                                                                                    
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data + local_120 * 8)
                                       + 8 + (long)(int)local_d8.first.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 0x20))
            ;
          }
          iVar5 = (int)local_d8.first.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
          local_d8.first.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_d8.first.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
          pvVar1 = (this->super_RuleGenerator).tokens.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (iVar5 < (int)((ulong)(*(long *)((long)&(pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data + lVar12 * 8 + 8
                                                ) -
                                      *(long *)((long)&(pvVar1->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data + lVar12 * 8))
                              >> 5));
      }
      if (local_148.
          super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_148.
          super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_148.
        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_148.
             super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      if ((this->trie).
          super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->trie).
          super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar12 = 0;
        uVar16 = 0;
        do {
          std::
          _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::clear((_Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)((long)&((_Alloc_hider *)
                             &(local_88.
                               super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_h)->_M_p + lVar12));
          uVar16 = uVar16 + 1;
          uVar6 = ((long)(this->trie).
                         super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->trie).
                         super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          lVar12 = lVar12 + 0x38;
        } while (uVar16 <= uVar6 && uVar6 - uVar16 != 0);
      }
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_168.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_d8.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>::
      emplace_back<int,std::pair<int,int>>
                ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                  *)&local_148,(int *)&local_168,(pair<int,_int> *)&local_d8);
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_88.
                    super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      _Hashtable<std::pair<int,int>,std::pair<int,int>,std::allocator<std::pair<int,int>>,std::__detail::_Identity,std::equal_to<std::pair<int,int>>,pairii_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::pair<int,int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int,int>,true>>>>
                ((_Hashtable<std::pair<int,int>,std::pair<int,int>,std::allocator<std::pair<int,int>>,std::__detail::_Identity,std::equal_to<std::pair<int,int>>,pairii_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_88.
                    super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,&local_168,&local_d8);
      ppVar14 = local_148.
                super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = local_148.
               super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_a0 != 0) {
        uVar16 = 0;
        do {
          std::
          vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
          ::vector((vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                    *)&local_d8,&local_148);
          pbVar2 = local_d8.first.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar15 = local_d8.first.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar2;
              pbVar15 = (pointer)((long)&pbVar15->_M_string_length + 4)) {
            iVar5 = *(int *)&(pbVar15->_M_dataplus)._M_p;
            iVar10 = *(int *)((long)&(pbVar15->_M_dataplus)._M_p + 4);
            sVar7 = std::
                    _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::count(&(this->trie).
                             super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar5]._M_h,local_a8 + uVar16
                           );
            if (sVar7 != 0) {
              pmVar8 = std::__detail::
                       _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)((this->trie).
                                        super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + iVar5),
                                    local_a8 + uVar16);
              local_170 = (_Hashtable<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)CONCAT44(local_170._4_4_,*pmVar8);
              if (iVar10 == 0) {
                iVar10 = *(int *)((long)local_118 + uVar16 * 4) + 1;
              }
              kVar13.second = *(int *)((long)local_118 + uVar16 * 4) + 1;
              kVar13.first = iVar10;
              local_168.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)kVar13;
              cVar9 = std::
                      _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)((long)*pmVar8 * 0x38 +
                                (long)local_88.
                                      super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start),
                             (key_type *)&local_168);
              if (cVar9.super__Node_iterator_base<std::pair<int,_int>,_true>._M_cur ==
                  (__node_type *)0x0) {
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)kVar13;
                std::
                vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                ::emplace_back<int&,std::pair<int,int>>
                          ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                            *)&local_148,(int *)&local_170,(key_type *)&local_168);
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)(int)local_170 * 0x38 +
                              (long)local_88.
                                    super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)kVar13;
                std::
                _Hashtable<std::pair<int,int>,std::pair<int,int>,std::allocator<std::pair<int,int>>,std::__detail::_Identity,std::equal_to<std::pair<int,int>>,pairii_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<std::pair<int,int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int,int>,true>>>>
                          ((_Hashtable<std::pair<int,int>,std::pair<int,int>,std::allocator<std::pair<int,int>>,std::__detail::_Identity,std::equal_to<std::pair<int,int>>,pairii_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_f8,
                           (key_type *)&local_168);
              }
            }
          }
          if (local_d8.first.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.first.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar16 = uVar16 + 1;
          ppVar14 = local_148.
                    super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = local_148.
                   super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar16 < local_a0);
      }
      for (; ppVar14 != ppVar3; ppVar14 = ppVar14 + 1) {
        pbVar2 = (this->contain_word).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar2[ppVar14->first]._M_string_length != 0) {
          iVar5 = (ppVar14->second).first;
          iVar10 = (ppVar14->second).second;
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_168,pbVar2 + ppVar14->first);
          if (iVar5 <= iVar10) {
            lVar12 = (long)(iVar5 + -1) << 5;
            iVar5 = (iVar10 - iVar5) + 1;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_f8,
                          (value_type *)
                          (*(long *)((long)&(((this->super_RuleGenerator).tokens.
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + local_120 * 8) +
                          lVar12));
              lVar12 = lVar12 + 0x20;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          if ((((long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x20) ||
              (__n = *(size_t *)
                      ((long)local_168.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8),
              __n != *(size_t *)
                      ((long)local_f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8))) ||
             ((__n != 0 &&
              (iVar5 = bcmp(*(void **)local_168.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                            *(void **)local_f8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,__n), iVar5 != 0))))
          {
            std::
            pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::
            pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                      (&local_d8,&local_168,&local_f8);
            local_170 = &local_68;
            std::
            _Hashtable<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Identity,std::equal_to<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,rule_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,true>>>>
                      ((_Hashtable<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Identity,std::equal_to<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,rule_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_170,&local_d8,&local_170);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_d8.second);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_d8.first);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_168);
        }
      }
      if (local_118 != (void *)0x0) {
        operator_delete(local_118);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      local_128 = local_128 + 1;
    } while (local_128 < (this->super_RuleGenerator).n);
  }
  pvVar4 = local_70;
  std::
  vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  vector<std::__detail::_Node_iterator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,true,true>,void>
            (local_70,(_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
                       )local_68._M_before_begin._M_nxt,
             (_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
              )0x0,(allocator_type *)&local_d8);
  if (local_148.
      super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&local_88);
  std::
  _Hashtable<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)pvVar4;
}

Assistant:

vector<t_rule> WildLCS::gen_rules()
{
	unordered_set<t_rule, rule_hash> rules;
	vector<unordered_set<pair<int, int>, pairii_hash>> used(trie.size());
	vector<pair<int, pair<int, int>>> H;

	for (int i = 0; i < n; i ++)
	{
		string cur_string = "";
		vector<int> token_id;

		for (int j = 0; j < (int) tokens[i].size(); j ++)
			for (int k = 0; k < (int) tokens[i][j].size(); k ++)
			{
				cur_string += tokens[i][j][k];
				token_id.push_back(j);
			}

		//traversal
		H.clear();
		for (auto j = 0; j < trie.size(); j ++)
			used[j].clear();
		H.emplace_back(0, make_pair(0, 0));
		used[0].insert(make_pair(0, 0));
		for (auto j = 0; j < cur_string.size(); j ++)
		{
			vector<pair<int, pair<int, int>>> cur_H = H;
			for (auto cp : cur_H)
			{
				int node = cp.first;
				int st = cp.second.first;
				int en = cp.second.second;

				//include current character
				if (trie[node].count(cur_string[j]))
				{
					int new_node = trie[node][cur_string[j]];
					int new_st = (st == 0 ? token_id[j] + 1 : st);
					int new_en = token_id[j] + 1;
					if (! used[new_node].count(make_pair(new_st, new_en)))
					{
						H.emplace_back(new_node, make_pair(new_st, new_en));
						used[new_node].insert(make_pair(new_st, new_en));
					}
				}
			}
		}

		//output rules
		for (auto cp : H)
		{
			int node = cp.first;
			int st = cp.second.first;
			int en = cp.second.second;
			if (! contain_word[node].size())
				continue;
			vector<string> lhs, rhs;
			lhs.push_back(contain_word[node]);
			for (int j = st - 1; j < en; j ++)
				rhs.push_back(tokens[i][j]);

			//get rid of identity rules
			if (rhs.size() == 1 && lhs[0] == rhs[0])
				continue;

			rules.insert(make_pair(lhs, rhs));
		}
	}

	return vector<t_rule>(rules.begin(), rules.end());
}